

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# svsetbase.h
# Opt level: O0

void __thiscall soplex::SVSetBase<double>::memRemax(SVSetBase<double> *this,int newmax)

{
  int iVar1;
  int iVar2;
  ptrdiff_t pVar3;
  Nonzero<double> *pNVar4;
  Nonzero<double> *in_RDI;
  int l_max;
  int sz;
  Nonzero<double> *newmem;
  DLPSV *ps;
  int used;
  ptrdiff_t delta;
  SVectorBase<double> *this_00;
  DLPSV *local_28;
  int in_stack_ffffffffffffffe0;
  int in_stack_ffffffffffffffe4;
  int iVar5;
  ClassArray<soplex::Nonzero<double>_> *in_stack_ffffffffffffffe8;
  
  pVar3 = ClassArray<soplex::Nonzero<double>_>::reMax
                    (in_stack_ffffffffffffffe8,in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0);
  if (pVar3 != 0) {
    iVar5 = 0;
    local_28 = IdList<soplex::SVSetBase<double>::DLPSV>::first
                         ((IdList<soplex::SVSetBase<double>::DLPSV> *)(in_RDI + 4));
    while (local_28 != (DLPSV *)0x0) {
      pNVar4 = SVectorBase<double>::mem(&local_28->super_SVectorBase<double>);
      this_00 = (SVectorBase<double> *)((long)&pNVar4->val + pVar3);
      iVar1 = SVectorBase<double>::size(&local_28->super_SVectorBase<double>);
      iVar2 = SVectorBase<double>::max(&local_28->super_SVectorBase<double>);
      SVectorBase<double>::setMem(this_00,iVar1,in_RDI);
      SVectorBase<double>::set_size(&local_28->super_SVectorBase<double>,iVar1);
      iVar5 = iVar1 + iVar5;
      local_28 = IdList<soplex::SVSetBase<double>::DLPSV>::next
                           ((IdList<soplex::SVSetBase<double>::DLPSV> *)this_00,
                            (DLPSV *)CONCAT44(iVar1,iVar2));
    }
    iVar1 = memSize((SVSetBase<double> *)0x266cda);
    in_RDI[5].idx = iVar1 - iVar5;
    *(undefined4 *)&in_RDI[5].field_0xc = 0;
  }
  return;
}

Assistant:

void memRemax(int newmax)
   {
      ptrdiff_t delta = SVSetBaseArray::reMax(newmax);

      if(delta != 0)
      {
#ifdef SOPLEX_DEBUG
         SPxOut::debug(this,
                       "counting unused memory (unusedMem = {}, numUnusedMemUpdates = {}, this = {})\n",
                       unusedMem, numUnusedMemUpdates, (void*)this);
#endif

         int used = 0;

         for(DLPSV* ps = list.first(); ps; ps = list.next(ps))
         {
            // get new shifted nonzero memory of the SVectorBase
            Nonzero<R>* newmem = reinterpret_cast<Nonzero<R>*>(reinterpret_cast<char*>(ps->mem()) + delta);

            // get the size and maximum capacity of the SVectorBase
            int sz = ps->size();
            int l_max = ps->max();
            assert(l_max >= sz);

            // set new nonzero memory
            ps->setMem(l_max, newmem);
            ps->set_size(sz);

            // count used memory
            used += sz;
         }

         // update estimation of unused memory to exact value
         unusedMem = memSize() - used;
         numUnusedMemUpdates = 0;

#ifdef SOPLEX_DEBUG
         SPxOut::debug(this, "               --> NEW: unusedMem = {}, after memRemax({})\n", unusedMem,
                       newmax);
#endif
      }
   }